

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reentrant.h
# Opt level: O0

int mutex_init(pthread_mutex_t *m,pthread_mutexattr_t *a)

{
  int iVar1;
  pthread_mutexattr_t local_1c;
  int rslt;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t *a_local;
  pthread_mutex_t *m_local;
  
  _rslt = a;
  a_local = (pthread_mutexattr_t *)m;
  pthread_mutexattr_init(&local_1c);
  pthread_mutexattr_settype(&local_1c,3);
  iVar1 = pthread_mutex_init((pthread_mutex_t *)a_local,&local_1c);
  pthread_mutexattr_destroy(&local_1c);
  return iVar1;
}

Assistant:

static inline int
mutex_init(pthread_mutex_t *m, const pthread_mutexattr_t *a
			     __attribute__ ((unused)))
{
	pthread_mutexattr_t attr;
	int rslt;

	pthread_mutexattr_init(&attr);
#if defined(__linux__)
	pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ADAPTIVE_NP);
#endif
	rslt = pthread_mutex_init(m, &attr);
	pthread_mutexattr_destroy(&attr);

	return (rslt);
}